

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

void * bsclose(bStream *s)

{
  void *parm;
  bStream *s_local;
  
  if (s == (bStream *)0x0) {
    s_local = (bStream *)0x0;
  }
  else {
    s->readFnPtr = (bNread)0x0;
    if (s->buff != (bstring)0x0) {
      bdestroy(s->buff);
    }
    s->buff = (bstring)0x0;
    s_local = (bStream *)s->parm;
    s->parm = (void *)0x0;
    s->isEOF = 1;
    free(s);
  }
  return s_local;
}

Assistant:

void * bsclose (struct bStream * s) {
void * parm;
	if (s == NULL) return NULL;
	s->readFnPtr = NULL;
	if (s->buff) bdestroy (s->buff);
	s->buff = NULL;
	parm = s->parm;
	s->parm = NULL;
	s->isEOF = 1;
	bstr__free (s);
	return parm;
}